

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void gnuplotio::
     deref_and_print<gnuplotio::PairOfRange<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
               (gnuplotio *stream,long arg)

{
  deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
            ();
  std::operator<<((ostream *)stream," ");
  deref_and_print<gnuplotio::IteratorRange<double_const*,double>,gnuplotio::ModeText>
            (stream,arg + 0x20);
  return;
}

Assistant:

void deref_and_print(std::ostream &stream, const PairOfRange<T, U> &arg, PrintMode) {
    deref_and_print(stream, arg.l, PrintMode());
    if(PrintMode::is_text) stream << " ";
    deref_and_print(stream, arg.r, PrintMode());
}